

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_protocol.h
# Opt level: O2

char * cppcms::http::protocol::tocken<char_const*>(char *begin,char *end)

{
  bool bVar1;
  
  for (; (begin < end && ((byte)(*begin - 0x20U) < 0x5f)); begin = begin + 1) {
    bVar1 = separator(*begin);
    if (bVar1) {
      return begin;
    }
  }
  return begin;
}

Assistant:

It tocken(It begin,It end)
	{
		char c;
		while(begin < end && 0x20<=(c=*begin) && c<=0x7E && !separator(c))
			begin++;
		return begin;
	}